

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

optional<tinyusdz::Animatable<int>_> *
tinyusdz::prim::anon_unknown_0::ConvertToAnimatable<int>
          (optional<tinyusdz::Animatable<int>_> *__return_storage_ptr__,PrimVar *var)

{
  double t;
  bool bVar1;
  TimeSamples *pTVar2;
  Sample *pSVar3;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *this;
  value_type_conflict7 *pvVar4;
  optional<int> local_80;
  optional<int> local_78;
  optional<int> pv_1;
  Sample *s;
  size_t i;
  optional<int> local_54;
  optional<int> pv;
  bool ok;
  undefined1 local_40 [8];
  Animatable<int> dst;
  PrimVar *var_local;
  
  dst._ts._24_8_ = var;
  Animatable<int>::Animatable((Animatable<int> *)local_40);
  bVar1 = primvar::PrimVar::is_valid((PrimVar *)dst._ts._24_8_);
  if (bVar1) {
    pv._3_1_ = 0;
    bVar1 = primvar::PrimVar::has_value((PrimVar *)dst._ts._24_8_);
    if (bVar1) {
      primvar::PrimVar::get_value<int>((optional<int> *)((long)&i + 4),(PrimVar *)dst._ts._24_8_);
      nonstd::optional_lite::optional<int>::optional<int,_0>
                (&local_54,(optional<int> *)((long)&i + 4));
      nonstd::optional_lite::optional<int>::~optional((optional<int> *)((long)&i + 4));
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_54);
      if (bVar1) {
        pvVar4 = nonstd::optional_lite::optional<int>::value(&local_54);
        Animatable<int>::set_default((Animatable<int> *)local_40,pvVar4);
        pv._3_1_ = 1;
      }
      nonstd::optional_lite::optional<int>::~optional(&local_54);
    }
    bVar1 = primvar::PrimVar::has_timesamples((PrimVar *)dst._ts._24_8_);
    if (bVar1) {
      s = (Sample *)0x0;
      while( true ) {
        pTVar2 = primvar::PrimVar::ts_raw((PrimVar *)dst._ts._24_8_);
        pSVar3 = (Sample *)tinyusdz::value::TimeSamples::size(pTVar2);
        if (pSVar3 <= s) break;
        pTVar2 = primvar::PrimVar::ts_raw((PrimVar *)dst._ts._24_8_);
        this = tinyusdz::value::TimeSamples::get_samples(pTVar2);
        pv_1 = (optional<int>)
               ::std::
               vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ::operator[](this,(size_type)s);
        if ((*(bool *)((long)pv_1 + 0x20) & 1U) == 0) {
          tinyusdz::value::Value::get_value<int>(&local_80,(Value *)((long)pv_1 + 8),false);
          nonstd::optional_lite::optional<int>::optional<int,_0>(&local_78,&local_80);
          nonstd::optional_lite::optional<int>::~optional(&local_80);
          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_78);
          if (bVar1) {
            t = *(double *)pv_1;
            pvVar4 = nonstd::optional_lite::optional<int>::value(&local_78);
            Animatable<int>::add_sample((Animatable<int> *)local_40,t,pvVar4);
          }
          else {
            nonstd::optional_lite::optional<tinyusdz::Animatable<int>_>::optional
                      (__return_storage_ptr__);
          }
          pv.contained._1_3_ = 0;
          pv.contained._0_1_ = !bVar1;
          nonstd::optional_lite::optional<int>::~optional(&local_78);
          if (pv.contained != (storage_t<int>)0x0) goto LAB_002eeb53;
        }
        else {
          Animatable<int>::add_blocked_sample((Animatable<int> *)local_40,*(double *)pv_1);
        }
        s = (Sample *)((long)&s->t + 1);
      }
      pv._3_1_ = 1;
    }
    if ((pv._3_1_ & 1) == 0) {
      nonstd::optional_lite::optional<tinyusdz::Animatable<int>_>::optional(__return_storage_ptr__);
      pv.contained = (storage_t<int>)0x1;
    }
    else {
      nonstd::optional_lite::optional<tinyusdz::Animatable<int>_>::
      optional<tinyusdz::Animatable<int>,_0>(__return_storage_ptr__,(Animatable<int> *)local_40);
      pv.contained = (storage_t<int>)0x1;
    }
  }
  else {
    nonstd::optional_lite::optional<tinyusdz::Animatable<int>_>::optional(__return_storage_ptr__);
    pv.contained = (storage_t<int>)0x1;
  }
LAB_002eeb53:
  Animatable<int>::~Animatable((Animatable<int> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

static nonstd::optional<Animatable<T>> ConvertToAnimatable(const primvar::PrimVar &var)
{
  Animatable<T> dst;

  if (!var.is_valid()) {
    DCOUT("is_valid failed");
    DCOUT("has_value " << var.has_value());
    DCOUT("has_timesamples " << var.has_timesamples());
    return nonstd::nullopt;
  }

  bool ok = false;

  if (var.has_value()) {

    if (auto pv = var.get_value<T>()) {
      dst.set_default(pv.value());

      ok = true;
      //return std::move(dst);
    }
  }

  if (var.has_timesamples()) {
    for (size_t i = 0; i < var.ts_raw().size(); i++) {
      const value::TimeSamples::Sample &s = var.ts_raw().get_samples()[i];

      // Attribute Block?
      if (s.blocked) {
        dst.add_blocked_sample(s.t);
      } else if (auto pv = s.value.get_value<T>()) {
        dst.add_sample(s.t, pv.value());
      } else {
        // Type mismatch
        DCOUT(i << "/" << var.ts_raw().size() << " type mismatch.");
        return nonstd::nullopt;
      }
    }

    ok = true;
  }

  if (ok) {
    return std::move(dst);
  }

  DCOUT("???");
  return nonstd::nullopt;
}